

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

int fy_emit_document_end(fy_emitter *emit)

{
  int iVar1;
  
  iVar1 = fy_emit_common_document_end(emit);
  if (iVar1 == 0) {
    emit->fyd = (fy_document *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int fy_emit_document_end(struct fy_emitter *emit) {
    int ret;

    ret = fy_emit_common_document_end(emit);
    if (ret)
        return ret;

    emit->fyd = NULL;
    return 0;
}